

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

bool CheckBlock(CBlock *block,BlockValidationState *state,Params *consensusParams,bool fCheckPOW,
               bool fCheckMerkleRoot)

{
  pointer psVar1;
  bool bVar2;
  byte bVar3;
  bool bVar4;
  uint uVar5;
  size_t sVar6;
  ulong uVar7;
  undefined3 in_register_00000081;
  undefined4 uVar8;
  undefined4 in_register_00000084;
  shared_ptr<const_CTransaction> *tx;
  pointer psVar9;
  int iVar10;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string local_e0;
  string local_c0;
  TxValidationState tx_state;
  string local_58;
  long local_38;
  
  uVar8 = CONCAT31(in_register_00000081,fCheckMerkleRoot);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (block->fChecked != false) {
LAB_00362429:
    bVar3 = 1;
    goto LAB_00362671;
  }
  bVar2 = CheckBlockHeader(&block->super_CBlockHeader,state,consensusParams,fCheckPOW);
  if (bVar2) {
    if (((consensusParams->signet_blocks & fCheckPOW) != 1) ||
       (bVar2 = CheckSignetBlockSolution(block,consensusParams), bVar2)) {
      if ((fCheckMerkleRoot) && (bVar2 = CheckMerkleRoot(block,state), !bVar2)) goto LAB_00362516;
      psVar9 = (block->vtx).
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      psVar1 = (block->vtx).
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)psVar9 - (long)psVar1) < 0xf42401 && psVar9 != psVar1) {
        tx_state.super_ValidationState<TxValidationResult>._0_8_ = &TX_NO_WITNESS;
        tx_state.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p =
             (pointer)block;
        sVar6 = GetSerializeSize<ParamsWrapper<TransactionSerParams,CBlock_const>>
                          ((ParamsWrapper<TransactionSerParams,_const_CBlock> *)&tx_state);
        if (sVar6 * 4 < 0x3d0901) {
          psVar9 = (block->vtx).
                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((psVar9 == (block->vtx).
                         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish) ||
             (bVar2 = CTransaction::IsCoinBase
                                ((psVar9->
                                 super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)
                                 ._M_ptr), !bVar2)) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&tx_state,"bad-cb-missing",(allocator<char> *)&local_c0);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_58,"first tx is not coinbase",(allocator<char> *)&local_e0);
            bVar3 = ValidationState<BlockValidationResult>::Invalid
                              (&state->super_ValidationState<BlockValidationResult>,BLOCK_CONSENSUS,
                               (string *)&tx_state,&local_58);
          }
          else {
            uVar7 = 1;
            do {
              psVar9 = (block->vtx).
                       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              psVar1 = (block->vtx).
                       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              if ((ulong)((long)psVar1 - (long)psVar9 >> 4) <= uVar7) goto LAB_003626a1;
              bVar2 = CTransaction::IsCoinBase
                                (psVar9[uVar7].
                                 super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
              uVar7 = (ulong)((int)uVar7 + 1);
            } while (!bVar2);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&tx_state,"bad-cb-multiple",(allocator<char> *)&local_c0);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_58,"more than one coinbase",(allocator<char> *)&local_e0);
            bVar3 = ValidationState<BlockValidationResult>::Invalid
                              (&state->super_ValidationState<BlockValidationResult>,BLOCK_CONSENSUS,
                               (string *)&tx_state,&local_58);
          }
          goto LAB_00362657;
        }
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&tx_state,"bad-blk-length",(allocator<char> *)&local_c0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,"size limits failed",(allocator<char> *)&local_e0);
      bVar3 = ValidationState<BlockValidationResult>::Invalid
                        (&state->super_ValidationState<BlockValidationResult>,BLOCK_CONSENSUS,
                         (string *)&tx_state,&local_58);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&tx_state,"bad-signet-blksig",(allocator<char> *)&local_c0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,"signet block signature validation failure",
                 (allocator<char> *)&local_e0);
      bVar3 = ValidationState<BlockValidationResult>::Invalid
                        (&state->super_ValidationState<BlockValidationResult>,BLOCK_CONSENSUS,
                         (string *)&tx_state,&local_58);
    }
LAB_00362657:
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&tx_state);
  }
  else {
LAB_00362516:
    bVar3 = 0;
  }
LAB_00362671:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (bool)(bVar3 & 1);
LAB_003626a1:
  if (psVar9 != psVar1) goto code_r0x003626aa;
  psVar1 = (block->vtx).
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  iVar10 = 0;
  for (psVar9 = (block->vtx).
                super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar9 != psVar1; psVar9 = psVar9 + 1) {
    uVar5 = GetLegacySigOpCount((psVar9->
                                super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                                _M_ptr);
    iVar10 = iVar10 + uVar5;
  }
  if ((uint)(iVar10 << 2) < 0x13881) {
    if (fCheckPOW && fCheckMerkleRoot) {
      block->fChecked = true;
    }
    goto LAB_00362429;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tx_state,"bad-blk-sigops",(allocator<char> *)&local_c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"out-of-bounds SigOpCount",(allocator<char> *)&local_e0);
  bVar3 = ValidationState<BlockValidationResult>::Invalid
                    (&state->super_ValidationState<BlockValidationResult>,BLOCK_CONSENSUS,
                     (string *)&tx_state,&local_58);
  goto LAB_00362657;
code_r0x003626aa:
  tx_state.super_ValidationState<TxValidationResult>.m_mode = M_VALID;
  tx_state.super_ValidationState<TxValidationResult>.m_result = TX_RESULT_UNSET;
  tx_state.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)&tx_state.super_ValidationState<TxValidationResult>.m_reject_reason.field_2;
  tx_state.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length = 0;
  tx_state.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._M_local_buf[0] = '\0';
  tx_state.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p =
       (pointer)&tx_state.super_ValidationState<TxValidationResult>.m_debug_message.field_2;
  tx_state.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length = 0;
  tx_state.super_ValidationState<TxValidationResult>.m_debug_message.field_2._M_local_buf[0] = '\0';
  bVar2 = CheckTransaction((psVar9->
                           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr,&tx_state);
  if (!bVar2) {
    if (tx_state.super_ValidationState<TxValidationResult>.m_result != TX_CONSENSUS) {
      __assert_fail("tx_state.GetResult() == TxValidationResult::TX_CONSENSUS",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                    ,0xfcd,
                    "bool CheckBlock(const CBlock &, BlockValidationState &, const Consensus::Params &, bool, bool)"
                   );
    }
    std::__cxx11::string::string
              ((string *)&local_58,
               &tx_state.super_ValidationState<TxValidationResult>.m_reject_reason);
    base_blob<256u>::ToString_abi_cxx11_
              (&local_e0,
               (base_blob<256u> *)
               &((psVar9->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                )->hash);
    std::__cxx11::string::string
              ((string *)&local_100,
               &tx_state.super_ValidationState<TxValidationResult>.m_debug_message);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (&local_c0,(tinyformat *)"Transaction check failed (tx hash %s) %s",(char *)&local_e0,
               &local_100,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_register_00000084,uVar8));
    bVar4 = ValidationState<BlockValidationResult>::Invalid
                      (&state->super_ValidationState<BlockValidationResult>,BLOCK_CONSENSUS,
                       &local_58,&local_c0);
    uVar7 = (ulong)bVar4;
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_58);
  }
  bVar3 = (byte)uVar7;
  ValidationState<TxValidationResult>::~ValidationState
            (&tx_state.super_ValidationState<TxValidationResult>);
  psVar9 = psVar9 + 1;
  if (!bVar2) goto LAB_00362671;
  goto LAB_003626a1;
}

Assistant:

bool CheckBlock(const CBlock& block, BlockValidationState& state, const Consensus::Params& consensusParams, bool fCheckPOW, bool fCheckMerkleRoot)
{
    // These are checks that are independent of context.

    if (block.fChecked)
        return true;

    // Check that the header is valid (particularly PoW).  This is mostly
    // redundant with the call in AcceptBlockHeader.
    if (!CheckBlockHeader(block, state, consensusParams, fCheckPOW))
        return false;

    // Signet only: check block solution
    if (consensusParams.signet_blocks && fCheckPOW && !CheckSignetBlockSolution(block, consensusParams)) {
        return state.Invalid(BlockValidationResult::BLOCK_CONSENSUS, "bad-signet-blksig", "signet block signature validation failure");
    }

    // Check the merkle root.
    if (fCheckMerkleRoot && !CheckMerkleRoot(block, state)) {
        return false;
    }

    // All potential-corruption validation must be done before we do any
    // transaction validation, as otherwise we may mark the header as invalid
    // because we receive the wrong transactions for it.
    // Note that witness malleability is checked in ContextualCheckBlock, so no
    // checks that use witness data may be performed here.

    // Size limits
    if (block.vtx.empty() || block.vtx.size() * WITNESS_SCALE_FACTOR > MAX_BLOCK_WEIGHT || ::GetSerializeSize(TX_NO_WITNESS(block)) * WITNESS_SCALE_FACTOR > MAX_BLOCK_WEIGHT)
        return state.Invalid(BlockValidationResult::BLOCK_CONSENSUS, "bad-blk-length", "size limits failed");

    // First transaction must be coinbase, the rest must not be
    if (block.vtx.empty() || !block.vtx[0]->IsCoinBase())
        return state.Invalid(BlockValidationResult::BLOCK_CONSENSUS, "bad-cb-missing", "first tx is not coinbase");
    for (unsigned int i = 1; i < block.vtx.size(); i++)
        if (block.vtx[i]->IsCoinBase())
            return state.Invalid(BlockValidationResult::BLOCK_CONSENSUS, "bad-cb-multiple", "more than one coinbase");

    // Check transactions
    // Must check for duplicate inputs (see CVE-2018-17144)
    for (const auto& tx : block.vtx) {
        TxValidationState tx_state;
        if (!CheckTransaction(*tx, tx_state)) {
            // CheckBlock() does context-free validation checks. The only
            // possible failures are consensus failures.
            assert(tx_state.GetResult() == TxValidationResult::TX_CONSENSUS);
            return state.Invalid(BlockValidationResult::BLOCK_CONSENSUS, tx_state.GetRejectReason(),
                                 strprintf("Transaction check failed (tx hash %s) %s", tx->GetHash().ToString(), tx_state.GetDebugMessage()));
        }
    }
    unsigned int nSigOps = 0;
    for (const auto& tx : block.vtx)
    {
        nSigOps += GetLegacySigOpCount(*tx);
    }
    if (nSigOps * WITNESS_SCALE_FACTOR > MAX_BLOCK_SIGOPS_COST)
        return state.Invalid(BlockValidationResult::BLOCK_CONSENSUS, "bad-blk-sigops", "out-of-bounds SigOpCount");

    if (fCheckPOW && fCheckMerkleRoot)
        block.fChecked = true;

    return true;
}